

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rcamera.h
# Opt level: O1

void UpdateCamera(Camera *camera,int mode)

{
  uint uVar1;
  float fVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  float fVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  bool rotateAroundTarget;
  _Bool lockView;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float local_68;
  float local_48;
  
  if ((4 < (uint)mode) || (lockView = true, (0x1aU >> (mode & 0x1fU) & 1) == 0)) {
    lockView = mode == 2;
  }
  if (mode != 0) {
    fVar11 = (float)CORE.Time.frame;
    if (mode == 2) {
      fVar2 = (camera->up).x;
      fVar5 = (camera->up).y;
      local_68 = (camera->up).z;
      fVar8 = local_68 * local_68 + fVar2 * fVar2 + fVar5 * fVar5;
      if (fVar8 < 0.0) {
        fVar8 = sqrtf(fVar8);
      }
      else {
        fVar8 = SQRT(fVar8);
      }
      if ((fVar8 != 0.0) || (NAN(fVar8))) {
        fVar8 = 1.0 / fVar8;
        fVar2 = fVar2 * fVar8;
        fVar5 = fVar5 * fVar8;
        local_68 = local_68 * fVar8;
      }
      fVar8 = local_68 * local_68 + fVar2 * fVar2 + fVar5 * fVar5;
      local_48 = fVar5;
      if ((fVar8 != 1.0) || (NAN(fVar8))) {
        if ((fVar8 != 0.0) || (NAN(fVar8))) {
          if (fVar8 < 0.0) {
            fVar8 = sqrtf(fVar8);
          }
          else {
            fVar8 = SQRT(fVar8);
          }
          fVar8 = 1.0 / fVar8;
          fVar2 = fVar2 * fVar8;
          local_48 = fVar5 * fVar8;
          local_68 = local_68 * fVar8;
        }
      }
      fVar5 = sinf(fVar11 * 0.5);
      fVar8 = cosf(fVar11 * 0.5);
      fVar13 = 1.0 - fVar8;
      fVar16 = local_48 * fVar2 * fVar13;
      fVar10 = local_68 * fVar2 * fVar13;
      fVar12 = local_68 * local_48 * fVar13;
      uVar3 = (camera->position).x;
      uVar6 = (camera->position).y;
      uVar4 = (camera->target).x;
      uVar7 = (camera->target).y;
      fVar11 = (camera->target).z;
      fVar14 = (float)uVar3 - (float)uVar4;
      fVar15 = (float)uVar6 - (float)uVar7;
      fVar9 = (camera->position).z - fVar11;
      (camera->position).x =
           (fVar10 + local_48 * fVar5) * fVar9 +
           (fVar2 * fVar2 * fVar13 + fVar8) * fVar14 + (fVar16 - local_68 * fVar5) * fVar15 + 0.0 +
           (float)uVar4;
      (camera->position).y =
           (fVar12 - fVar2 * fVar5) * fVar9 +
           (fVar16 + local_68 * fVar5) * fVar14 + (local_48 * local_48 * fVar13 + fVar8) * fVar15 +
           0.0 + (float)uVar7;
      (camera->position).z =
           fVar9 * (local_68 * local_68 * fVar13 + fVar8) +
           fVar14 * (fVar10 - local_48 * fVar5) + fVar15 * (fVar12 + fVar2 * fVar5) + 0.0 + fVar11;
    }
    else {
      rotateAroundTarget = mode == 4 || mode == 2;
      fVar8 = CORE.Input.Mouse.currentPosition.x - CORE.Input.Mouse.previousPosition.x;
      fVar2 = CORE.Input.Mouse.currentPosition.y - CORE.Input.Mouse.previousPosition.y;
      fVar5 = fVar11 * 0.03;
      if (CORE.Input.Keyboard.currentKeyState[0x108] == '\x01') {
        CameraPitch(camera,-fVar5,lockView,rotateAroundTarget,false);
      }
      if (CORE.Input.Keyboard.currentKeyState[0x109] == '\x01') {
        CameraPitch(camera,fVar5,lockView,rotateAroundTarget,false);
      }
      if (CORE.Input.Keyboard.currentKeyState[0x106] == '\x01') {
        CameraYaw(camera,-fVar5,rotateAroundTarget);
      }
      if (CORE.Input.Keyboard.currentKeyState[0x107] == '\x01') {
        CameraYaw(camera,fVar5,rotateAroundTarget);
      }
      if (CORE.Input.Keyboard.currentKeyState[0x51] == '\x01') {
        CameraRoll(camera,-fVar5);
      }
      if (CORE.Input.Keyboard.currentKeyState[0x45] == '\x01') {
        CameraRoll(camera,fVar5);
      }
      uVar1 = mode - 3;
      if ((mode == 1) &&
         ((CORE.Input.Touch.currentTouchState[2] == '\x01' ||
          (CORE.Input.Mouse.currentButtonState[2] == '\x01')))) {
        fVar8 = CORE.Input.Mouse.currentPosition.x - CORE.Input.Mouse.previousPosition.x;
        fVar5 = CORE.Input.Mouse.currentPosition.y - CORE.Input.Mouse.previousPosition.y;
        fVar2 = fVar11 * 0.2;
        if (0.0 < fVar8) {
          CameraMoveRight(camera,fVar2,uVar1 < 2);
        }
        if (fVar8 < 0.0) {
          CameraMoveRight(camera,-fVar2,uVar1 < 2);
        }
        if (0.0 < fVar5) {
          CameraMoveUp(camera,-fVar2);
        }
        if (fVar5 < 0.0) {
          CameraMoveUp(camera,fVar2);
        }
      }
      else {
        CameraYaw(camera,fVar8 * -0.003,rotateAroundTarget);
        CameraPitch(camera,fVar2 * -0.003,lockView,rotateAroundTarget,false);
      }
      fVar11 = fVar11 * 5.4;
      if (CORE.Input.Keyboard.currentKeyState[0x57] == '\x01') {
        CameraMoveForward(camera,fVar11,uVar1 < 2);
      }
      if (CORE.Input.Keyboard.currentKeyState[0x41] == '\x01') {
        CameraMoveRight(camera,-fVar11,uVar1 < 2);
      }
      if (CORE.Input.Keyboard.currentKeyState[0x53] == '\x01') {
        CameraMoveForward(camera,-fVar11,uVar1 < 2);
      }
      if (CORE.Input.Keyboard.currentKeyState[0x44] == '\x01') {
        CameraMoveRight(camera,fVar11,uVar1 < 2);
      }
      if (CORE.Input.Gamepad.ready[0] == true) {
        fVar2 = CORE.Input.Gamepad.axisState[0][2];
        if (CORE.Input.Gamepad.axisState[0][2] == 0.0) {
          fVar2 = 0.0;
        }
        CameraYaw(camera,fVar2 * -2.0 * 0.003,rotateAroundTarget);
        fVar2 = -0.0;
        if ((CORE.Input.Gamepad.ready[0] == true) && (CORE.Input.Gamepad.axisState[0][3] != 0.0)) {
          fVar2 = CORE.Input.Gamepad.axisState[0][3] * -2.0 * 0.003;
        }
        CameraPitch(camera,fVar2,lockView,rotateAroundTarget,false);
        if (((CORE.Input.Gamepad.ready[0] == true) && (CORE.Input.Gamepad.axisState[0][1] != 0.0))
           && (CORE.Input.Gamepad.axisState[0][1] <= -0.25)) {
          CameraMoveForward(camera,fVar11,uVar1 < 2);
        }
        if (((CORE.Input.Gamepad.ready[0] == true) && (CORE.Input.Gamepad.axisState[0][0] != 0.0))
           && (CORE.Input.Gamepad.axisState[0][0] <= -0.25)) {
          CameraMoveRight(camera,-fVar11,uVar1 < 2);
        }
        if (((CORE.Input.Gamepad.ready[0] == true) && (CORE.Input.Gamepad.axisState[0][1] != 0.0))
           && (0.25 <= CORE.Input.Gamepad.axisState[0][1])) {
          CameraMoveForward(camera,-fVar11,uVar1 < 2);
        }
        if (((CORE.Input.Gamepad.ready[0] == true) && (CORE.Input.Gamepad.axisState[0][0] != 0.0))
           && (0.25 <= CORE.Input.Gamepad.axisState[0][0])) {
          CameraMoveRight(camera,fVar11,uVar1 < 2);
        }
      }
      if (mode == 1) {
        if (CORE.Input.Keyboard.currentKeyState[0x20] == '\x01') {
          CameraMoveUp(camera,fVar11);
        }
        if (CORE.Input.Keyboard.currentKeyState[0x155] == '\x01') {
          CameraMoveUp(camera,-fVar11);
        }
      }
    }
    if (((uint)mode < 5) && ((0x16U >> (mode & 0x1fU) & 1) != 0)) {
      CameraMoveToTarget(camera,-(float)(~-(uint)(ABS(CORE.Input.Mouse.currentWheelMove.y) <
                                                 ABS(CORE.Input.Mouse.currentWheelMove.x)) &
                                         (uint)CORE.Input.Mouse.currentWheelMove.y |
                                        (uint)CORE.Input.Mouse.currentWheelMove.x &
                                        -(uint)(ABS(CORE.Input.Mouse.currentWheelMove.y) <
                                               ABS(CORE.Input.Mouse.currentWheelMove.x))));
      if ((CORE.Input.Keyboard.previousKeyState[0x14d] == '\0') &&
         (CORE.Input.Keyboard.currentKeyState[0x14d] == '\x01')) {
        CameraMoveToTarget(camera,2.0);
      }
      if ((CORE.Input.Keyboard.previousKeyState[0x14e] == '\0') &&
         (CORE.Input.Keyboard.currentKeyState[0x14e] == '\x01')) {
        CameraMoveToTarget(camera,-2.0);
        return;
      }
    }
  }
  return;
}

Assistant:

void UpdateCamera(Camera *camera, int mode)
{
    Vector2 mousePositionDelta = GetMouseDelta();

    bool moveInWorldPlane = ((mode == CAMERA_FIRST_PERSON) || (mode == CAMERA_THIRD_PERSON));
    bool rotateAroundTarget = ((mode == CAMERA_THIRD_PERSON) || (mode == CAMERA_ORBITAL));
    bool lockView = ((mode == CAMERA_FREE) || (mode == CAMERA_FIRST_PERSON) || (mode == CAMERA_THIRD_PERSON) || (mode == CAMERA_ORBITAL));
    bool rotateUp = false;

    // Camera speeds based on frame time
    float cameraMoveSpeed = CAMERA_MOVE_SPEED*GetFrameTime();
    float cameraRotationSpeed = CAMERA_ROTATION_SPEED*GetFrameTime();
    float cameraPanSpeed = CAMERA_PAN_SPEED*GetFrameTime();
    float cameraOrbitalSpeed = CAMERA_ORBITAL_SPEED*GetFrameTime();

    if (mode == CAMERA_CUSTOM) {}
    else if (mode == CAMERA_ORBITAL)
    {
        // Orbital can just orbit
        Matrix rotation = MatrixRotate(GetCameraUp(camera), cameraOrbitalSpeed);
        Vector3 view = Vector3Subtract(camera->position, camera->target);
        view = Vector3Transform(view, rotation);
        camera->position = Vector3Add(camera->target, view);
    }
    else
    {
        // Camera rotation
        if (IsKeyDown(KEY_DOWN)) CameraPitch(camera, -cameraRotationSpeed, lockView, rotateAroundTarget, rotateUp);
        if (IsKeyDown(KEY_UP)) CameraPitch(camera, cameraRotationSpeed, lockView, rotateAroundTarget, rotateUp);
        if (IsKeyDown(KEY_RIGHT)) CameraYaw(camera, -cameraRotationSpeed, rotateAroundTarget);
        if (IsKeyDown(KEY_LEFT)) CameraYaw(camera, cameraRotationSpeed, rotateAroundTarget);
        if (IsKeyDown(KEY_Q)) CameraRoll(camera, -cameraRotationSpeed);
        if (IsKeyDown(KEY_E)) CameraRoll(camera, cameraRotationSpeed);

        // Camera movement
        // Camera pan (for CAMERA_FREE)
        if ((mode == CAMERA_FREE) && (IsMouseButtonDown(MOUSE_BUTTON_MIDDLE)))
        {
            const Vector2 mouseDelta = GetMouseDelta();
            if (mouseDelta.x > 0.0f) CameraMoveRight(camera, cameraPanSpeed, moveInWorldPlane);
            if (mouseDelta.x < 0.0f) CameraMoveRight(camera, -cameraPanSpeed, moveInWorldPlane);
            if (mouseDelta.y > 0.0f) CameraMoveUp(camera, -cameraPanSpeed);
            if (mouseDelta.y < 0.0f) CameraMoveUp(camera, cameraPanSpeed);
        }
        else
        {
            // Mouse support
            CameraYaw(camera, -mousePositionDelta.x*CAMERA_MOUSE_MOVE_SENSITIVITY, rotateAroundTarget);
            CameraPitch(camera, -mousePositionDelta.y*CAMERA_MOUSE_MOVE_SENSITIVITY, lockView, rotateAroundTarget, rotateUp);
        }

        // Keyboard support
        if (IsKeyDown(KEY_W)) CameraMoveForward(camera, cameraMoveSpeed, moveInWorldPlane);
        if (IsKeyDown(KEY_A)) CameraMoveRight(camera, -cameraMoveSpeed, moveInWorldPlane);
        if (IsKeyDown(KEY_S)) CameraMoveForward(camera, -cameraMoveSpeed, moveInWorldPlane);
        if (IsKeyDown(KEY_D)) CameraMoveRight(camera, cameraMoveSpeed, moveInWorldPlane);

        // Gamepad movement
        if (IsGamepadAvailable(0))
        {
            // Gamepad controller support
            CameraYaw(camera, -(GetGamepadAxisMovement(0, GAMEPAD_AXIS_RIGHT_X)*2)*CAMERA_MOUSE_MOVE_SENSITIVITY, rotateAroundTarget);
            CameraPitch(camera, -(GetGamepadAxisMovement(0, GAMEPAD_AXIS_RIGHT_Y)*2)*CAMERA_MOUSE_MOVE_SENSITIVITY, lockView, rotateAroundTarget, rotateUp);

            if (GetGamepadAxisMovement(0, GAMEPAD_AXIS_LEFT_Y) <= -0.25f) CameraMoveForward(camera, cameraMoveSpeed, moveInWorldPlane);
            if (GetGamepadAxisMovement(0, GAMEPAD_AXIS_LEFT_X) <= -0.25f) CameraMoveRight(camera, -cameraMoveSpeed, moveInWorldPlane);
            if (GetGamepadAxisMovement(0, GAMEPAD_AXIS_LEFT_Y) >= 0.25f) CameraMoveForward(camera, -cameraMoveSpeed, moveInWorldPlane);
            if (GetGamepadAxisMovement(0, GAMEPAD_AXIS_LEFT_X) >= 0.25f) CameraMoveRight(camera, cameraMoveSpeed, moveInWorldPlane);
        }

        if (mode == CAMERA_FREE)
        {
            if (IsKeyDown(KEY_SPACE)) CameraMoveUp(camera, cameraMoveSpeed);
            if (IsKeyDown(KEY_LEFT_CONTROL)) CameraMoveUp(camera, -cameraMoveSpeed);
        }
    }

    if ((mode == CAMERA_THIRD_PERSON) || (mode == CAMERA_ORBITAL) || (mode == CAMERA_FREE))
    {
        // Zoom target distance
        CameraMoveToTarget(camera, -GetMouseWheelMove());
        if (IsKeyPressed(KEY_KP_SUBTRACT)) CameraMoveToTarget(camera, 2.0f);
        if (IsKeyPressed(KEY_KP_ADD)) CameraMoveToTarget(camera, -2.0f);
    }
}